

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsk.c
# Opt level: O3

int maintain_version(char *file,int forcep)

{
  FileName *pFVar1;
  char *pcVar2;
  int iVar3;
  int *piVar4;
  size_t sVar5;
  char *pcVar6;
  char *pcVar7;
  int highest_p;
  char ver [16];
  char fname [255];
  char old_file [4096];
  char dir [4096];
  char vless [4096];
  int local_313c;
  char local_3138 [16];
  char local_3128 [256];
  char local_3028 [4096];
  char local_2028 [4096];
  char local_1028 [4096];
  
  iVar3 = unpack_filename(file,local_2028,local_3128,local_3138,1);
  if (iVar3 == 0) {
    return 0;
  }
  iVar3 = true_name(local_2028);
  if (iVar3 != -1) {
    return 0;
  }
  iVar3 = get_version_array(local_2028,local_3128);
  if (iVar3 == 0) {
    return 0;
  }
  if ((VA.files)->version_no == 0xffffffff) {
    return 1;
  }
  if (((VA.files)->version_no == 0) && (VA.files[1].version_no == 0xffffffff)) {
    if (forcep == 0) {
      return 1;
    }
    get_versionless(VA.files,local_1028,local_2028);
    strcpy(local_3128,local_1028);
    sVar5 = strlen(local_3128);
    (local_3128 + sVar5)[0] = '.';
    (local_3128 + sVar5)[1] = '~';
    local_3128[sVar5 + 2] = '\0';
    sVar5 = strlen(local_3128);
    (local_3128 + sVar5)[0] = '1';
    (local_3128 + sVar5)[1] = '\0';
    sVar5 = strlen(local_3128);
    (local_3128 + sVar5)[0] = '~';
    (local_3128 + sVar5)[1] = '\0';
    alarm(TIMEOUT_TIME);
    piVar4 = __errno_location();
    do {
      *piVar4 = 0;
      iVar3 = link(local_1028,local_3128);
      if (iVar3 != -1) {
LAB_0011c86f:
        alarm(0);
        return 1;
      }
    } while (*piVar4 == 4);
    alarm(0);
    iVar3 = *piVar4;
  }
  else {
    pcVar6 = local_2028;
    iVar3 = get_versionless(VA.files,local_1028,pcVar6);
    pFVar1 = VA.files;
    if (iVar3 == 0) {
      pcVar6 = local_2028;
      for (pcVar7 = pcVar6; (pcVar2 = pcVar7, *pcVar7 == '/' || (pcVar2 = pcVar6, *pcVar7 != '\0'));
          pcVar7 = pcVar7 + 1) {
        pcVar6 = pcVar2;
      }
      if (pcVar7 + -1 == pcVar6) {
        if (pcVar6 == local_2028) {
          local_3028[0] = '/';
          local_3028[1] = '\0';
        }
        else {
          strcpy(local_3028,local_2028);
        }
      }
      else {
        strcpy(local_3028,local_2028);
        sVar5 = strlen(local_3028);
        (local_3028 + sVar5)[0] = '/';
        (local_3028 + sVar5)[1] = '\0';
      }
      strcat(local_3028,pFVar1->name);
      strcpy(local_3128,pFVar1->name);
      separate_version(local_3128,local_3138,1);
      pcVar6 = local_2028;
      for (pcVar7 = pcVar6; (pcVar2 = pcVar7, *pcVar7 == '/' || (pcVar2 = pcVar6, *pcVar7 != '\0'));
          pcVar7 = pcVar7 + 1) {
        pcVar6 = pcVar2;
      }
      if (pcVar7 + -1 == pcVar6) {
        if (pcVar6 == local_2028) {
          local_1028[0] = '/';
          local_1028[1] = '\0';
        }
        else {
          strcpy(local_1028,local_2028);
        }
      }
      else {
        strcpy(local_1028,local_2028);
        sVar5 = strlen(local_1028);
        (local_1028 + sVar5)[0] = '/';
        (local_1028 + sVar5)[1] = '\0';
      }
      strcat(local_1028,local_3128);
      alarm(TIMEOUT_TIME);
      piVar4 = __errno_location();
      do {
        *piVar4 = 0;
        iVar3 = link(local_3028,local_1028);
        if (iVar3 != -1) goto LAB_0011c86f;
      } while (*piVar4 == 4);
      alarm(0);
      iVar3 = *piVar4;
    }
    else {
      iVar3 = check_vless_link(local_1028,VA.files,local_3028,&local_313c);
      if (iVar3 == 0) {
        return 0;
      }
      if (local_3028[0] != '\0') {
        if (local_313c != 0) {
          return 1;
        }
        alarm(TIMEOUT_TIME);
        piVar4 = __errno_location();
LAB_0011c389:
        *piVar4 = 0;
        iVar3 = unlink(local_1028);
        if (iVar3 == -1) goto code_r0x0011c3a0;
        alarm(0);
        pFVar1 = VA.files;
        for (pcVar7 = pcVar6;
            (pcVar2 = pcVar7, *pcVar7 == '/' || (pcVar2 = pcVar6, *pcVar7 != '\0'));
            pcVar7 = pcVar7 + 1) {
          pcVar6 = pcVar2;
        }
        if (pcVar7 + -1 == pcVar6) {
          if (pcVar6 == local_2028) {
            local_3028[0] = '/';
            local_3028[1] = '\0';
          }
          else {
            strcpy(local_3028,local_2028);
          }
        }
        else {
          strcpy(local_3028,local_2028);
          sVar5 = strlen(local_3028);
          (local_3028 + sVar5)[0] = '/';
          (local_3028 + sVar5)[1] = '\0';
        }
        strcat(local_3028,pFVar1->name);
        strcpy(local_3128,pFVar1->name);
        separate_version(local_3128,local_3138,1);
        pcVar6 = local_2028;
        for (pcVar7 = pcVar6;
            (pcVar2 = pcVar7, *pcVar7 == '/' || (pcVar2 = pcVar6, *pcVar7 != '\0'));
            pcVar7 = pcVar7 + 1) {
          pcVar6 = pcVar2;
        }
        if (pcVar7 + -1 == pcVar6) {
          if (pcVar6 == local_2028) {
            local_1028[0] = '/';
            local_1028[1] = '\0';
          }
          else {
            strcpy(local_1028,local_2028);
          }
        }
        else {
          strcpy(local_1028,local_2028);
          sVar5 = strlen(local_1028);
          (local_1028 + sVar5)[0] = '/';
          (local_1028 + sVar5)[1] = '\0';
        }
        strcat(local_1028,local_3128);
        alarm(TIMEOUT_TIME);
        do {
          *piVar4 = 0;
          iVar3 = link(local_3028,local_1028);
          if (iVar3 != -1) goto LAB_0011c86f;
        } while (*piVar4 == 4);
        goto LAB_0011c853;
      }
      sprintf(local_3138,"%u",(ulong)((VA.files)->version_no + 1));
      strcpy(local_3028,local_1028);
      if (local_3138[0] != '\0') {
        sVar5 = strlen(local_3028);
        (local_3028 + sVar5)[0] = '.';
        (local_3028 + sVar5)[1] = '~';
        local_3028[sVar5 + 2] = '\0';
        strcat(local_3028,local_3138);
        sVar5 = strlen(local_3028);
        (local_3028 + sVar5)[0] = '~';
        (local_3028 + sVar5)[1] = '\0';
      }
      alarm(TIMEOUT_TIME);
      piVar4 = __errno_location();
      do {
        *piVar4 = 0;
        iVar3 = link(local_1028,local_3028);
        if (iVar3 != -1) goto LAB_0011c86f;
      } while (*piVar4 == 4);
LAB_0011c853:
      alarm(0);
      iVar3 = *piVar4;
    }
  }
  *Lisp_errno = iVar3;
  return 0;
code_r0x0011c3a0:
  if (*piVar4 != 4) goto LAB_0011c853;
  goto LAB_0011c389;
}

Assistant:

static int maintain_version(char *file, int forcep)
{
  char dir[MAXPATHLEN], fname[MAXNAMLEN], ver[VERSIONLEN];
  char old_file[MAXPATHLEN], vless[MAXPATHLEN];
  int highest_p;
  int rval, max_no;
  FileName *entry;

  if (unpack_filename(file, dir, fname, ver, 1) == 0) return (0);
  /*
   * We have to make sure that dir is the existing directory.
   */
  if (true_name(dir) != -1) return (0);
  if (get_version_array(dir, fname) == 0) return (0);

  if (NoFileP(VA.files)) {
    /*
     * We don't need to care about such case that there is no such file
     * or an only versionless file exists.
     */
    return (1);
  }

  if (OnlyVersionlessP(VA.files)) {
    if (forcep) {
/*
 * If forcep, we link the versionless file to the version
 * 1 file.
 */
#ifndef DOS
      get_versionless(VA.files, vless, dir);
      ConcNameAndVersion(vless, "1", fname);
      TIMEOUT(rval = link(vless, fname));
      if (rval == -1) {
        *Lisp_errno = errno;
        return (0);
      }
#endif /* DOS */
    }
    return (1);
  }

  /*
   * At this point, we are sure that at least one file with version number
   * exists.  Thus, FindHighestVersion works fine from now on.
   */

  if (get_versionless(VA.files, vless, dir) == 0) {
    /*
     * There is not a versionless file, but at least one versioned file.
     * Thus, the thing we have to do is to link a versionless file
     * to the existing highest versioned file.
     */
    FindHighestVersion(VA.files, entry, max_no);
    ConcDirAndName(dir, entry->name, old_file);
/*
 * The versionless file should have the same case name as the old
 * file.
 */
#ifndef DOS
    strcpy(fname, entry->name);
    separate_version(fname, ver, 1);
    ConcDirAndName(dir, fname, vless);
    TIMEOUT(rval = link(old_file, vless));
    if (rval == -1) {
      *Lisp_errno = errno;
      return (0);
    }
#endif /* DOS */
    return (1);
  }

  if (check_vless_link(vless, VA.files, old_file, &highest_p) == 0) return (0);

  if (*old_file == '\0') {
    /*
     * The versionless file is not linked to any file in VA.files.
     * Thus, we have to link the versionless file to the file which
     * is versioned one higher than the existing highest version.
     */
    FindHighestVersion(VA.files, entry, max_no);
    sprintf(ver, "%u", max_no + 1);
/*
 * The old file should have the same case name as the versionless
 * file.
 */
#ifndef DOS
    ConcNameAndVersion(vless, ver, old_file);
    TIMEOUT(rval = link(vless, old_file));
    if (rval == -1) {
      *Lisp_errno = errno;
      return (0);
    }
#endif /* DOS */
    return (1);
  }

  if (highest_p) {
    /*
     * The versionless file has been already linked to the highest
     * versioned file.  Thus, there is nothing to do.
     */
    return (1);
  } else {
    /*
     * Although the  versionless file is linked to a file in VA.files,
     * the file is not the highest versioned file.  We have to unlink
     * the wrongly linked versionless file, and link the highest versioned
     * file to a versionless file.
     */
    TIMEOUT(rval = unlink(vless));
    if (rval == -1) {
      *Lisp_errno = errno;
      return (0);
    }
    FindHighestVersion(VA.files, entry, max_no);
    ConcDirAndName(dir, entry->name, old_file);
/*
 * The versionless file should have the same case name as the old
 * file.
 */
#ifndef DOS
    strcpy(fname, entry->name);
    separate_version(fname, ver, 1);
    ConcDirAndName(dir, fname, vless);
    TIMEOUT(rval = link(old_file, vless));
    if (rval == -1) {
      *Lisp_errno = errno;
      return (0);
    }
#endif /* DOS */
    return (1);
  }
}